

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

NTRUEncodeSchedule * ntru_encode_schedule(uint16_t *ms_in,size_t n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  NTRUEncodeSchedule *sched_00;
  uint local_64;
  uint32_t m;
  uint32_t *tmp;
  uint32_t m_1;
  uint32_t m2;
  uint32_t m1;
  size_t i_1;
  size_t nnew;
  size_t i;
  uint32_t *msnew;
  uint32_t *ms;
  NTRUEncodeSchedule *sched;
  size_t n_local;
  uint16_t *ms_in_local;
  
  sched_00 = (NTRUEncodeSchedule *)safemalloc(1,0x28,0);
  sched_00->nvals = n;
  sched_00->endpos = n - 1;
  sched_00->opsize = 0;
  sched_00->nops = 0;
  sched_00->ops = (uint32_t *)0x0;
  if (n == 0) {
    __assert_fail("n != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c",
                  0x272,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
  }
  msnew = (uint32_t *)safemalloc(n,4,0);
  i = (size_t)safemalloc(n,4,0);
  for (nnew = 0; sched = (NTRUEncodeSchedule *)n, nnew < n; nnew = nnew + 1) {
    msnew[nnew] = (uint)ms_in[nnew];
  }
  do {
    puVar3 = msnew;
    if (sched < (NTRUEncodeSchedule *)0x2) {
      if (sched != (NTRUEncodeSchedule *)0x1) {
        __assert_fail("n == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ntru.c"
                      ,0x2b4,"NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *, size_t)");
      }
      for (local_64 = *msnew; 1 < local_64; local_64 = local_64 + 0xff >> 8) {
        sched_append(sched_00,1);
      }
      safefree(msnew);
      safefree((void *)i);
      return sched_00;
    }
    i_1 = 0;
    for (_m2 = (NTRUEncodeSchedule *)0x0; _m2 < sched;
        _m2 = (NTRUEncodeSchedule *)((long)&_m2->nvals + 2)) {
      if ((NTRUEncodeSchedule *)((long)&_m2->nvals + 1) == sched) {
        sched_append(sched_00,0);
        *(uint32_t *)(i + i_1 * 4) = msnew[(long)_m2];
        i_1 = i_1 + 1;
        break;
      }
      uVar1 = msnew[(long)_m2];
      uVar2 = msnew[(long)((long)&_m2->nvals + 1)];
      sched_append(sched_00,(short)uVar1 + 2);
      for (tmp._4_4_ = uVar1 * uVar2; 0x3fff < tmp._4_4_; tmp._4_4_ = tmp._4_4_ + 0xff >> 8) {
        sched_append(sched_00,1);
      }
      *(uint *)(i + i_1 * 4) = tmp._4_4_;
      i_1 = i_1 + 1;
    }
    msnew = (uint32_t *)i;
    sched = (NTRUEncodeSchedule *)i_1;
    i = (size_t)puVar3;
  } while( true );
}

Assistant:

NTRUEncodeSchedule *ntru_encode_schedule(const uint16_t *ms_in, size_t n)
{
    NTRUEncodeSchedule *sched = snew(NTRUEncodeSchedule);
    sched->nvals = n;
    sched->endpos = n-1;
    sched->nops = sched->opsize = 0;
    sched->ops = NULL;

    assert(n != 0);

    /*
     * 'ms' is the list of (m_i) on input to the current pass.
     * 'ms_new' is the list output from the current pass. After each
     * pass we swap the arrays round.
     */
    uint32_t *ms = snewn(n, uint32_t);
    uint32_t *msnew = snewn(n, uint32_t);
    for (size_t i = 0; i < n; i++)
        ms[i] = ms_in[i];

    while (n > 1) {
        size_t nnew = 0;
        for (size_t i = 0; i < n; i += 2) {
            if (i+1 == n) {
                /*
                 * Odd element at the end of the input list: just copy
                 * it unchanged to the output.
                 */
                sched_append(sched, ENC_COPY);
                msnew[nnew++] = ms[i];
                break;
            }

            /*
             * Normal case: consume two elements from the input list
             * and combine them.
             */
            uint32_t m1 = ms[i], m2 = ms[i+1], m = m1*m2;
            sched_append(sched, ENC_COMBINE_BASE + m1);

            /*
             * And then, as long as the combined limit is big enough,
             * emit an output byte from the bottom of it.
             */
            while (m >= (1<<14)) {
                sched_append(sched, ENC_BYTE);
                m = (m + 0xFF) >> 8;
            }

            /*
             * Whatever is left after that, we emit into the output
             * list and append to the fifo.
             */
            msnew[nnew++] = m;
        }

        /*
         * End of pass. The output list of (m_i) now becomes the input
         * list.
         */
        uint32_t *tmp = ms;
        ms = msnew;
        n = nnew;
        msnew = tmp;
    }

    /*
     * When that loop terminates, it's because there's exactly one
     * number left to encode. (Or, technically, _at most_ one - but we
     * don't support encoding a completely empty list in this
     * implementation, because what would be the point?) That number
     * is just emitted little-endian until its limit is 1 (meaning its
     * only possible actual value is 0).
     */
    assert(n == 1);
    uint32_t m = ms[0];
    while (m > 1) {
        sched_append(sched, ENC_BYTE);
        m = (m + 0xFF) >> 8;
    }

    sfree(ms);
    sfree(msnew);

    return sched;
}